

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O3

void __thiscall embree::BVHN<4>::BVHN(BVHN<4> *this,PrimitiveType *primTy,Scene *scene)

{
  (this->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (this->super_AccelData).type = TY_BVH4;
  (this->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__BVHN_0218a938;
  *(PrimitiveType **)&(this->super_AccelData).field_0x58 = primTy;
  this->device = *(Device **)&(scene->super_AccelN).field_0x188;
  this->scene = scene;
  (this->root).ptr = 8;
  FastAllocator::FastAllocator
            (&this->alloc,*(Device **)&(scene->super_AccelN).field_0x188,
             (scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE,false,true);
  (this->objects).super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->objects).super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects).super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->numPrimitives = 0;
  this->numVertices = 0;
  (this->subdiv_patches).size_active = 0;
  (this->subdiv_patches).size_alloced = 0;
  (this->subdiv_patches).items = (char *)0x0;
  return;
}

Assistant:

BVHN<N>::BVHN (const PrimitiveType& primTy, Scene* scene)
    : AccelData((N==4) ? AccelData::TY_BVH4 : (N==8) ? AccelData::TY_BVH8 : AccelData::TY_UNKNOWN),
      primTy(&primTy), device(scene->device), scene(scene),
      root(emptyNode), alloc(scene->device,scene->isStaticAccel()), numPrimitives(0), numVertices(0)
  {
  }